

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O3

void __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  size_t *psVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mtx_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->state_).nwriter != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cv_);
    } while ((this->state_).nwriter != 0);
  }
  psVar1 = &(this->state_).nreader;
  *psVar1 = *psVar1 + 1;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void lock_shared()
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (RwLockPolicy::wait_rlock(state_)) {
      cv_.wait(lk);
    }
    RwLockPolicy::acquire_rlock(state_);
  }